

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O0

AddrMan * EnsureAddrman(NodeContext *node)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  type pAVar4;
  long in_FS_OFFSET;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *in_stack_ffffffffffffff98;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool(in_stack_ffffffffffffff98);
  if (bVar2) {
    pAVar4 = std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*
                       (in_stack_ffffffffffffffa8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pAVar4;
    }
  }
  else {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0,(allocator<char> *)in_stack_ffffffffffffffd8);
    JSONRPCError(in_stack_ffffffffffffffec,in_stack_ffffffffffffffd8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

AddrMan& EnsureAddrman(const NodeContext& node)
{
    if (!node.addrman) {
        throw JSONRPCError(RPC_CLIENT_P2P_DISABLED, "Error: Address manager functionality missing or disabled");
    }
    return *node.addrman;
}